

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

void __thiscall Portal::update(Portal *this,int currentTimeInMillis)

{
  PortalState PVar1;
  int iVar2;
  
  iVar2 = piksel::Timer::getElapsedTimeInMillis(&this->timer,currentTimeInMillis);
  PVar1 = this->state;
  if (PVar1 == CLOSING) {
    if (iVar2 < 0x15f) {
      this->scale = (350.0 - (float)iVar2) / 350.0;
    }
    else {
      this->state = CLOSED;
    }
  }
  else {
    if (PVar1 == OPEN) {
      this->state = CLOSING;
      piksel::Timer::reset(&this->timer,currentTimeInMillis);
      return;
    }
    if (PVar1 == OPENING) {
      if (iVar2 < 0x15f) {
        this->scale = (float)iVar2 / 350.0;
      }
      else {
        this->state = OPEN;
      }
    }
  }
  return;
}

Assistant:

void Portal::update(int currentTimeInMillis) {
    int elapsedTimeInMillis = timer.getElapsedTimeInMillis(currentTimeInMillis);
    switch (state) {
        case CLOSED:
            break;
        case OPENING:
            if (elapsedTimeInMillis > PORTAL_DURATION) {
                state = OPEN;
            } else {
                scale = elapsedTimeInMillis / PORTAL_DURATION;
            }
            break;
        case OPEN:
            close(currentTimeInMillis);
            break;
        case CLOSING:
            if (elapsedTimeInMillis > PORTAL_DURATION) {
                state = CLOSED;
            } else {
                scale = (PORTAL_DURATION - elapsedTimeInMillis) / PORTAL_DURATION;
            }
            break;
    }
}